

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int refineBySim1_left(saucy *s,coloring *c)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t *randVec;
  saucy_graph *__ptr;
  void **ppvVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  
  if (s->pNtk->vPos->nSize != 1) {
    if (0 < NUM_SIM1_ITERATION) {
      iVar4 = 0;
      while( true ) {
        lVar5 = (long)s->pNtk->vPos->nSize;
        if (lVar5 < 1) break;
        lVar11 = 0;
        while (c->clen[lVar11] == 0) {
          lVar11 = lVar11 + 1;
          if (lVar5 == lVar11) goto LAB_0030d2d3;
        }
        randVec = assignRandomBitsToCells(s->pNtk,c);
        __ptr = buildSim1Graph(s->pNtk,c,randVec,s->iDep,s->oDep);
        if (__ptr == (saucy_graph *)0x0) {
          __assert_fail("g != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSaucy.c"
                        ,0x506,"int refineBySim1_left(struct saucy *, struct coloring *)");
        }
        piVar8 = __ptr->adj;
        s->adj = piVar8;
        s->edg = __ptr->edg;
        iVar10 = s->nsplits;
        if (0 < s->n) {
          piVar7 = c->clen;
          iVar3 = 0;
          do {
            if (piVar7[iVar3] == 0) {
              piVar7 = s->sinduce;
              iVar9 = s->nsinduce;
              s->nsinduce = iVar9 + 1;
            }
            else {
              piVar7 = s->ninduce;
              iVar9 = s->nninduce;
              s->nninduce = iVar9 + 1;
            }
            piVar7[iVar9] = iVar3;
            s->indmark[iVar3] = '\x01';
            piVar7 = c->clen;
            iVar3 = iVar3 + piVar7[iVar3] + 1;
          } while (iVar3 < s->n);
        }
        refine(s,c);
        if (iVar10 < s->nsplits) {
          pVVar2 = s->randomVectorArray_sim1;
          uVar1 = pVVar2->nSize;
          if (uVar1 == pVVar2->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
              }
              pVVar2->pArray = ppvVar6;
              pVVar2->nCap = 0x10;
            }
            else {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
              }
              pVVar2->pArray = ppvVar6;
              pVVar2->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar6 = pVVar2->pArray;
          }
          iVar4 = pVVar2->nSize;
          pVVar2->nSize = iVar4 + 1;
          ppvVar6[iVar4] = randVec;
          if (0 < s->n) {
            piVar8 = c->clen;
            iVar4 = 0;
            do {
              if (piVar8[iVar4] == 0) {
                piVar8 = s->sinduce;
                iVar10 = s->nsinduce;
                s->nsinduce = iVar10 + 1;
              }
              else {
                piVar8 = s->ninduce;
                iVar10 = s->nninduce;
                s->nninduce = iVar10 + 1;
              }
              piVar8[iVar10] = iVar4;
              s->indmark[iVar4] = '\x01';
              piVar8 = c->clen;
              iVar4 = iVar4 + piVar8[iVar4] + 1;
            } while (iVar4 < s->n);
          }
          s->adj = s->depAdj;
          s->edg = s->depEdg;
          refine(s,c);
          piVar8 = __ptr->adj;
          iVar4 = 1;
        }
        else {
          if (randVec->pArray != (int *)0x0) {
            free(randVec->pArray);
          }
          free(randVec);
          iVar4 = iVar4 + 1;
        }
        if (piVar8 != (int *)0x0) {
          free(piVar8);
        }
        if (__ptr->edg != (int *)0x0) {
          free(__ptr->edg);
        }
        free(__ptr);
        if (NUM_SIM1_ITERATION <= iVar4) break;
      }
    }
LAB_0030d2d3:
    s->randomVectorSplit_sim1[s->lev] = s->randomVectorArray_sim1->nSize;
  }
  return 1;
}

Assistant:

static int
refineBySim1_left(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;
    int i, j;
    int allOutputsAreDistinguished;
    int nsplits;

    if (Abc_NtkPoNum(s->pNtk) == 1) return 1;
    
    for (i = 0; i < NUM_SIM1_ITERATION; i++) {

        /* if all outputs are distinguished, quit */
        allOutputsAreDistinguished = 1;
        for (j = 0; j < Abc_NtkPoNum(s->pNtk); j++) {
            if (c->clen[j]) {
                allOutputsAreDistinguished = 0;
                break;
            }
        }
        if (allOutputsAreDistinguished) break;

        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim1Graph(s->pNtk, c, randVec, s->iDep, s->oDep);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;

        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {
            /* save the random vector */
            Vec_PtrPush(s->randomVectorArray_sim1, randVec);            
            i = 0;  /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        else
            Vec_IntFree(randVec);

        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }

    s->randomVectorSplit_sim1[s->lev] = Vec_PtrSize(s->randomVectorArray_sim1); 

    return 1;
}